

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::for_statement::print(for_statement *this,wostream *os)

{
  statement *psVar1;
  expression *peVar2;
  wostream *pwVar3;
  
  std::operator<<(os,"for_statement{");
  psVar1 = (this->init_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 == (statement *)0x0) {
    std::operator<<(os,"{}");
  }
  else {
    (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x10))(psVar1,os);
  }
  std::operator<<(os,',');
  peVar2 = (this->cond_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (peVar2 == (expression *)0x0) {
    std::operator<<(os,"{}");
  }
  else {
    (**(code **)((long)(peVar2->super_syntax_node)._vptr_syntax_node + 0x10))(peVar2,os);
  }
  std::operator<<(os,',');
  peVar2 = (this->iter_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (peVar2 == (expression *)0x0) {
    std::operator<<(os,"{}");
  }
  else {
    (**(code **)((long)(peVar2->super_syntax_node)._vptr_syntax_node + 0x10))(peVar2,os);
  }
  pwVar3 = std::operator<<(os,',');
  psVar1 = (this->s_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x10))(psVar1,pwVar3);
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "for_statement{";
        if (init_) os << *init_; else os << "{}";
        os << ',';
        if (cond_) os << *cond_; else os << "{}";
        os << ',';
        if (iter_) os << *iter_; else os << "{}";
        os << ',' << *s_;
        os << "}";
    }